

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
          (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int64_t size)

{
  int64_t *piVar1;
  int64_t *piVar2;
  ulong uVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01651130;
  this->fStore = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<std::basic_string<char>>::TPZVec(const int64_t) [T = std::basic_string<char>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      uVar3 = size << 5;
      piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | uVar3 | 8);
      *piVar1 = size;
      piVar2 = piVar1 + 3;
      do {
        piVar2[-2] = (int64_t)piVar2;
        piVar2[-1] = 0;
        *(undefined1 *)piVar2 = 0;
        piVar2 = piVar2 + 4;
        uVar3 = uVar3 - 0x20;
      } while (uVar3 != 0);
      this->fStore = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (piVar1 + 1);
    }
    this->fNElements = size;
    this->fNAlloc = size;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}